

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

wchar_t pick_chest_traps(object *obj)

{
  uint32_t uVar1;
  wchar_t wVar2;
  wchar_t local_24;
  wchar_t local_20;
  wchar_t trap;
  wchar_t level;
  object *obj_local;
  
  local_24 = obj->kind->level;
  uVar1 = Rand_div(10);
  if (uVar1 == 0) {
    obj_local._4_4_ = L'\x01';
  }
  else {
    local_20 = pick_one_chest_trap(local_24);
    if ((L'\n' < local_24) && (uVar1 = Rand_div(4), uVar1 == 0)) {
      if (L'\x19' < local_24) {
        local_24 = L'\x19';
      }
      wVar2 = pick_one_chest_trap(local_24);
      local_20 = wVar2 | local_20;
    }
    obj_local._4_4_ = local_20;
  }
  return obj_local._4_4_;
}

Assistant:

int pick_chest_traps(struct object *obj)
{
	int level = obj->kind->level;
	int trap = 0;

	/* One in ten chance of no trap */
	if (one_in_(10)) {
		return 1;
	}

	/* Pick a trap, add it */
	trap |= pick_one_chest_trap(level);

	/* Chance of a second trap (may overlap the first one) */
	if ((level > 10) && one_in_(4)) {
		/* Second traps are never deep */
		trap |= pick_one_chest_trap(MIN(level, 25));
	}

	return trap;
}